

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O1

bool google::protobuf::compiler::cpp::anon_unknown_0::IsPOD(FieldDescriptor *field)

{
  byte bVar1;
  FieldDescriptor *local_18;
  _func_void_FieldDescriptor_ptr *local_10;
  
  if (((byte)field[1] & 8) == 0 && (~(byte)field[1] & 0x60) != 0) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_10 = FieldDescriptor::TypeOnceInit;
      local_18 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),&local_10,&local_18);
    }
    if (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) < 10) {
      bVar1 = (byte)(0x1fe >> ((byte)*(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                                              (ulong)(byte)field[2] * 4) & 0x1f));
      goto LAB_002b04d3;
    }
  }
  bVar1 = 0;
LAB_002b04d3:
  return (bool)(bVar1 & 1);
}

Assistant:

inline FieldDescriptor::Label FieldDescriptor::label() const {
  return static_cast<Label>(label_);
}